

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::add_dht_router
          (session_impl *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *node)

{
  callback_t cStack_58;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>
  local_38;
  
  this->m_outstanding_router_lookups = this->m_outstanding_router_lookups + 1;
  local_38._M_f = (offset_in_session_impl_to_subr)on_dht_router_name_lookup;
  local_38._8_8_ = 0;
  local_38._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_int>
  .super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_int>.
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_int>.super__Tuple_impl<3UL,_int>.
  super__Head_base<3UL,_int,_false>._M_head_impl =
       (_Tuple_impl<2UL,_std::_Placeholder<2>,_int>)node->second;
  local_38._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_int>
  .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl = this;
  ::std::
  function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,int))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int)>,void>
            ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
              *)&cStack_58,&local_38);
  resolver::async_resolve(&this->m_host_resolver,&node->first,(resolver_flags)0x2,&cStack_58);
  ::std::_Function_base::~_Function_base(&cStack_58.super__Function_base);
  return;
}

Assistant:

void session_impl::add_dht_router(std::pair<std::string, int> const& node)
	{
		ADD_OUTSTANDING_ASYNC("session_impl::on_dht_router_name_lookup");
		++m_outstanding_router_lookups;
		m_host_resolver.async_resolve(node.first, resolver::abort_on_shutdown
			, std::bind(&session_impl::on_dht_router_name_lookup
				, this, _1, _2, node.second));
	}